

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O3

aiBone * findBone(aiScene *scene,char *name)

{
  uint uVar1;
  aiMesh **ppaVar2;
  aiBone **ppaVar3;
  aiBone *paVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar1 = scene->mNumMeshes;
  if ((ulong)uVar1 != 0) {
    ppaVar2 = scene->mMeshes;
    uVar7 = 0;
    do {
      uVar6 = (ulong)ppaVar2[uVar7]->mNumBones;
      if (uVar6 != 0) {
        ppaVar3 = ppaVar2[uVar7]->mBones;
        uVar8 = 0;
        do {
          paVar4 = ppaVar3[uVar8];
          iVar5 = strcmp(name,(paVar4->mName).data);
          if (iVar5 == 0) {
            return paVar4;
          }
          uVar8 = uVar8 + 1;
        } while (uVar6 != uVar8);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar1);
  }
  return (aiBone *)0x0;
}

Assistant:

aiBone* findBone( const aiScene* scene, const char * name) {
    for (size_t m=0; m<scene->mNumMeshes; m++) {
        aiMesh * mesh = scene->mMeshes[m];
        for (size_t b=0; b<mesh->mNumBones; b++) {
            aiBone * bone = mesh->mBones[b];
            if (0 == strcmp(name, bone->mName.C_Str())) {
                return bone;
            }
        }
    }
    return NULL;
}